

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

void __thiscall VFS::CVFS::Copy(CVFS *this,string *From,string *To)

{
  bool bVar1;
  CVFSException *pCVar2;
  shared_ptr<VFS::CVFS::CVFSDir> sVar3;
  VFSNode DestNode;
  string local_88;
  VFSNode node;
  VFSNode copy;
  shared_ptr<VFS::CVFS::CVFSDir> DestParent;
  __shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar1 = NodeExists(this,From);
  if (!bVar1) {
    pCVar2 = (CVFSException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Can\'t copy node. Source node doesn\'t exists.",
               (allocator<char> *)&DestNode);
    CVFSException::CVFSException(pCVar2,&local_88,NODE_DOESNT_EXISTS);
    __cxa_throw(pCVar2,&CVFSException::typeinfo,CVFSException::~CVFSException);
  }
  bVar1 = NodeExists(this,To);
  if (!bVar1) {
    ExtractPath(&local_88,this,To);
    GetNodeInfo((CVFS *)&DestNode,&this->MAGIC);
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = CVFSNode::IsDir(DestNode.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    if (bVar1) {
      GetNodeInfo((CVFS *)&node,&this->MAGIC);
      sVar3 = std::static_pointer_cast<VFS::CVFS::CVFSDir,VFS::CVFSNode>
                        ((shared_ptr<VFS::CVFSNode> *)&DestParent);
      (**(node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_CVFSNode
      )(&copy,node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        sVar3.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _M_pi);
      ExtractName(&local_88,this,To);
      std::__cxx11::string::operator=
                ((string *)
                 &(copy.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_Name,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,&copy.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>);
      CVFSDir::AppendChild
                (DestParent.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(VFSNode *)&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&copy.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&DestParent.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&DestNode.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      return;
    }
    pCVar2 = (CVFSException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Can\'t copy node. Destination node parent is a file.",
               (allocator<char> *)&node);
    CVFSException::CVFSException(pCVar2,&local_88,NODE_IS_FILE);
    __cxa_throw(pCVar2,&CVFSException::typeinfo,CVFSException::~CVFSException);
  }
  pCVar2 = (CVFSException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Can\'t copy node. Destination node already exists.",
             (allocator<char> *)&DestNode);
  CVFSException::CVFSException(pCVar2,&local_88,NODE_ALREADY_EXISTS);
  __cxa_throw(pCVar2,&CVFSException::typeinfo,CVFSException::~CVFSException);
}

Assistant:

void Copy(const std::string &From, const std::string &To)
            {
                if(!NodeExists(From))
                    throw CVFSException("Can't copy node. Source node doesn't exists.", VFSError::NODE_DOESNT_EXISTS);

                if(NodeExists(To))
                    throw CVFSException("Can't copy node. Destination node already exists.", VFSError::NODE_ALREADY_EXISTS);

                auto DestNode = GetNodeInfo(ExtractPath(To));
                if(!DestNode->IsDir())
                    throw CVFSException("Can't copy node. Destination node parent is a file.", VFSError::NODE_IS_FILE);

                auto node = GetNodeInfo(From);
                auto DestParent = std::static_pointer_cast<CVFSDir>(DestNode);

                auto copy = node->Copy();
                copy->m_Name = ExtractName(To);

                DestParent->AppendChild(copy);
            }